

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

Varnode * __thiscall VarnodeBank::setInput(VarnodeBank *this,Varnode *vn)

{
  Varnode *pVVar1;
  LowlevelError *pLVar2;
  allocator local_39;
  string local_38;
  
  if ((vn->flags & 0x18) != 0) {
    pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&local_38,"Making input out of varnode which is not free",&local_39);
    LowlevelError::LowlevelError(pLVar2,&local_38);
    __cxa_throw(pLVar2,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  if ((vn->flags & 2) == 0) {
    std::
    _Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareLocDef,std::allocator<Varnode*>>
    ::erase_abi_cxx11_((_Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareLocDef,std::allocator<Varnode*>>
                        *)&this->loc_tree,(vn->lociter)._M_node);
    std::
    _Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareDefLoc,std::allocator<Varnode*>>
    ::erase_abi_cxx11_((_Rb_tree<Varnode*,Varnode*,std::_Identity<Varnode*>,VarnodeCompareDefLoc,std::allocator<Varnode*>>
                        *)&this->def_tree,(vn->defiter)._M_node);
    Varnode::setInput(vn);
    pVVar1 = xref(this,vn);
    return pVVar1;
  }
  pLVar2 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string((string *)&local_38,"Making input out of constant varnode",&local_39)
  ;
  LowlevelError::LowlevelError(pLVar2,&local_38);
  __cxa_throw(pLVar2,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void Varnode::clearCover(void) const

{
  if (cover != (Cover *)0) {
    delete cover;
    cover = (Cover *)0;
  }
}